

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void ShiftRows(AES_state *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar3;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  
  auVar1 = *(undefined1 (*) [16])s->slice;
  auVar13 = psllw(auVar1,3);
  uVar3 = auVar1._0_2_;
  auVar4._0_2_ = uVar3 >> 1;
  uVar6 = auVar1._2_2_;
  auVar4._2_2_ = uVar6 >> 1;
  uVar7 = auVar1._4_2_;
  auVar4._4_2_ = uVar7 >> 1;
  uVar8 = auVar1._6_2_;
  auVar4._6_2_ = uVar8 >> 1;
  uVar9 = auVar1._8_2_;
  auVar4._8_2_ = uVar9 >> 1;
  uVar10 = auVar1._10_2_;
  auVar4._10_2_ = uVar10 >> 1;
  uVar11 = auVar1._12_2_;
  uVar12 = auVar1._14_2_;
  auVar4._12_2_ = uVar11 >> 1;
  auVar4._14_2_ = uVar12 >> 1;
  auVar14 = psllw(auVar1,2);
  auVar5._0_2_ = uVar3 >> 2;
  auVar5._2_2_ = uVar6 >> 2;
  auVar5._4_2_ = uVar7 >> 2;
  auVar5._6_2_ = uVar8 >> 2;
  auVar5._8_2_ = uVar9 >> 2;
  auVar5._10_2_ = uVar10 >> 2;
  auVar5._12_2_ = uVar11 >> 2;
  auVar5._14_2_ = uVar12 >> 2;
  auVar15._2_2_ = uVar6 * 2;
  auVar15._0_2_ = uVar3 * 2;
  auVar15._4_2_ = uVar7 * 2;
  auVar15._6_2_ = uVar8 * 2;
  auVar15._8_2_ = uVar9 * 2;
  auVar15._10_2_ = uVar10 * 2;
  auVar15._12_2_ = uVar11 * 2;
  auVar15._14_2_ = uVar12 * 2;
  auVar2._0_2_ = uVar3 >> 3;
  auVar2._2_2_ = uVar6 >> 3;
  auVar2._4_2_ = uVar7 >> 3;
  auVar2._6_2_ = uVar8 >> 3;
  auVar2._8_2_ = uVar9 >> 3;
  auVar2._10_2_ = uVar10 >> 3;
  auVar2._12_2_ = uVar11 >> 3;
  auVar2._14_2_ = uVar12 >> 3;
  *(undefined1 (*) [16])s->slice =
       auVar2 & _DAT_001c10e0 | auVar15 & _DAT_001c10d0 | auVar5 & _DAT_001c10c0 |
       auVar14 & _DAT_001c10b0 | auVar4 & _DAT_001c10a0 |
       auVar13 & _DAT_001c1090 | _DAT_001c1080 & auVar1;
  return;
}

Assistant:

static void ShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 5, 3) | BIT_RANGE_RIGHT(v, 5, 8, 1) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 15, 1) | BIT_RANGE_RIGHT(v, 15, 16, 3);
    }
}